

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O3

void __thiscall ExecutablePcodeSleigh::restoreXml(ExecutablePcodeSleigh *this,Element *el)

{
  int iVar1;
  LowlevelError *this_00;
  pointer ppEVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  InjectPayload::restoreXml((InjectPayload *)this,el);
  ppEVar2 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 !=
      (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = false;
    do {
      while (iVar1 = std::__cxx11::string::compare((char *)*ppEVar2), iVar1 == 0) {
        std::__cxx11::string::_M_assign((string *)&this->parsestring);
        ppEVar2 = ppEVar2 + 1;
        bVar3 = true;
        if (ppEVar2 ==
            (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          return;
        }
      }
      ppEVar2 = ppEVar2 + 1;
    } while (ppEVar2 !=
             (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (bVar3) {
      return;
    }
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  (*(this->super_ExecutablePcode).super_InjectPayload._vptr_InjectPayload[5])(&local_70,this);
  std::operator+(&local_50,"Missing <body> subtag in <pcode>: ",&local_70);
  LowlevelError::LowlevelError(this_00,&local_50);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void ExecutablePcodeSleigh::restoreXml(const Element *el)

{
  InjectPayload::restoreXml(el);
  const List &list(el->getChildren());
  List::const_iterator iter;
  bool hasbody = false;
  for (iter = list.begin(); iter != list.end(); ++iter) {
    const Element *subel = *iter;
    if (subel->getName() == "body") {
      hasbody = true;
      parsestring = subel->getContent();
    }
  }
  if (!hasbody)
    throw LowlevelError("Missing <body> subtag in <pcode>: " + getSource());
}